

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O2

int dobindkey(KEYMAP *map,char *func,char *str)

{
  byte bVar1;
  buffer *pbVar2;
  ushort uVar3;
  int iVar4;
  __int32_t **pp_Var5;
  ulong in_RCX;
  ulong uVar6;
  KEYMAP *local_40;
  KEYMAP *map_local;
  
  pbVar2 = curbp;
  uVar6 = 0;
  local_40 = map;
  map_local = (KEYMAP *)func;
  do {
    bVar1 = *str;
    uVar3 = (ushort)(char)bVar1;
    if ((bVar1 == 0) || (7 < uVar6)) {
      key.k_count = (int)uVar6;
      iVar4 = bindkey(&local_40,(char *)map_local,(KCHAR *)(uVar6 & 0xffffffff),(int)in_RCX);
      return iVar4;
    }
    if (bVar1 == 0x5c) {
      bVar1 = ((byte *)str)[1];
      in_RCX = (ulong)bVar1;
      if (bVar1 == 0) goto LAB_0010d21d;
      str = (char *)((byte *)str + 1);
      if (bVar1 == 0x45) {
LAB_0010d1fa:
        uVar3 = 0x1b;
        goto LAB_0010d21d;
      }
      if (bVar1 == 0x4e) {
LAB_0010d206:
        uVar3 = (ushort)*pbVar2->b_nlchr;
        goto LAB_0010d21d;
      }
      if (bVar1 == 0x52) {
LAB_0010d200:
        uVar3 = 0xd;
        goto LAB_0010d21d;
      }
      if (bVar1 == 0x74) {
LAB_0010d1f4:
        uVar3 = 9;
        goto LAB_0010d21d;
      }
      if (bVar1 == 0x5c) {
        uVar3 = 0x5c;
        goto LAB_0010d21d;
      }
      if (bVar1 == 0x5e) {
        uVar3 = 0x5e;
        goto LAB_0010d21d;
      }
      if (bVar1 == 0x65) goto LAB_0010d1fa;
      if (bVar1 == 0x6e) goto LAB_0010d206;
      if (bVar1 == 0x72) goto LAB_0010d200;
      if (bVar1 == 0x54) goto LAB_0010d1f4;
    }
    else {
      in_RCX = (ulong)bVar1;
      if ((bVar1 == 0x5e) && (bVar1 = ((byte *)str)[1], (ulong)bVar1 != 0)) {
        str = (char *)((byte *)str + 1);
        pp_Var5 = __ctype_toupper_loc();
        uVar3 = (ushort)(*pp_Var5)[bVar1] ^ 0x40;
      }
LAB_0010d21d:
      key.k_chars[uVar6] = uVar3;
    }
    str = (char *)((byte *)str + 1);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int
dobindkey(KEYMAP *map, const char *func, const char *str)
{
	int	 i;

	for (i = 0; *str && i < MAXKEY; i++) {
		/* XXX - convert numbers w/ strol()? */
		if (*str == '^' && *(str + 1) !=  '\0') {
			key.k_chars[i] = CCHR(toupper((unsigned char)*++str));
		} else if (*str == '\\' && *(str + 1) != '\0') {
			switch (*++str) {
			case '^':
				key.k_chars[i] = '^';
				break;
			case 't':
			case 'T':
				key.k_chars[i] = '\t';
				break;
			case 'n':
			case 'N':
				key.k_chars[i] = *curbp->b_nlchr;
				break;
			case 'r':
			case 'R':
				key.k_chars[i] = '\r';
				break;
			case 'e':
			case 'E':
				key.k_chars[i] = CCHR('[');
				break;
			case '\\':
				key.k_chars[i] = '\\';
				break;
			}
		} else
			key.k_chars[i] = *str;
		str++;
	}
	key.k_count = i;
	return (bindkey(&map, func, key.k_chars, key.k_count));
}